

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O0

ComponentPtr __thiscall
libcellml::ComponentEntity::takeComponent
          (ComponentEntity *this,string *name,bool searchEncapsulated)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  ComponentEntityImpl *pCVar3;
  reference psVar4;
  ComponentImpl *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  element_type *peVar6;
  byte in_CL;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  ComponentPtr CVar7;
  byte local_d9;
  ComponentEntity local_80;
  ComponentEntity local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  size_t i;
  shared_ptr<libcellml::Component> *local_50;
  __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_48 [3];
  __normal_iterator<const_std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_30;
  const_iterator result;
  bool searchEncapsulated_local;
  string *name_local;
  ComponentEntity *this_local;
  ComponentPtr *foundComponent;
  
  result._M_current._7_1_ = in_CL & 1;
  result._M_current._6_1_ = 0;
  std::shared_ptr<libcellml::Component>::shared_ptr
            ((shared_ptr<libcellml::Component> *)this,(nullptr_t)0x0);
  pCVar3 = pFunc((ComponentEntity *)name);
  local_30._M_current =
       (shared_ptr<libcellml::Component> *)
       ComponentEntityImpl::findComponent
                 (pCVar3,(string *)CONCAT71(in_register_00000011,searchEncapsulated));
  pCVar3 = pFunc((ComponentEntity *)name);
  local_48[0]._M_current =
       (shared_ptr<libcellml::Component> *)
       std::
       vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
       ::end(&pCVar3->mComponents);
  bVar2 = __gnu_cxx::operator!=(&local_30,local_48);
  if (bVar2) {
    psVar4 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
             ::operator*(&local_30);
    std::shared_ptr<libcellml::Component>::operator=
              ((shared_ptr<libcellml::Component> *)this,psVar4);
    pCVar3 = pFunc((ComponentEntity *)name);
    local_50 = local_30._M_current;
    i = (size_t)std::
                vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                ::erase(&pCVar3->mComponents,(const_iterator)local_30._M_current);
    peVar6 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    this_00 = Component::pFunc(peVar6);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    _Var5._M_pi = extraout_RDX_00;
  }
  else {
    _Var5._M_pi = extraout_RDX;
    if ((result._M_current._7_1_ & 1) != 0) {
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      while( true ) {
        p_Var1 = local_60;
        _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      componentCount((ComponentEntity *)name);
        local_d9 = 0;
        if (p_Var1 < _Var5._M_pi) {
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
          local_d9 = bVar2 ^ 0xff;
          _Var5._M_pi = extraout_RDX_01;
        }
        if ((local_d9 & 1) == 0) break;
        component(&local_80,(size_t)name);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&local_80);
        takeComponent(&local_70,(string *)peVar6,searchEncapsulated);
        std::shared_ptr<libcellml::Component>::operator=
                  ((shared_ptr<libcellml::Component> *)this,
                   (shared_ptr<libcellml::Component> *)&local_70);
        std::shared_ptr<libcellml::Component>::~shared_ptr
                  ((shared_ptr<libcellml::Component> *)&local_70);
        std::shared_ptr<libcellml::Component>::~shared_ptr
                  ((shared_ptr<libcellml::Component> *)&local_80);
        local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_60->_vptr__Sp_counted_base + 1);
      }
    }
  }
  CVar7.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  CVar7.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ComponentPtr)CVar7.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr ComponentEntity::takeComponent(const std::string &name, bool searchEncapsulated)
{
    ComponentPtr foundComponent = nullptr;
    auto result = pFunc()->findComponent(name);
    if (result != pFunc()->mComponents.end()) {
        foundComponent = *result;
        pFunc()->mComponents.erase(result);
        foundComponent->pFunc()->removeParent();
    } else if (searchEncapsulated) {
        for (size_t i = 0; i < componentCount() && !foundComponent; ++i) {
            foundComponent = component(i)->takeComponent(name, searchEncapsulated);
        }
    }

    return foundComponent;
}